

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GoogleCloudKms.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::GoogleCloudKms::deregisterKey
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,GoogleCloudKms *this,Path *path)

{
  Client *client;
  string local_b8;
  Path local_98;
  Url local_78;
  _Hashtable<_ea4cb122_> local_58;
  
  client = *(Client **)this;
  Vault::operator+(&local_b8,"keys/deregister/",path);
  local_98.value_._M_dataplus._M_p = (pointer)&local_98.value_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
    local_98.value_.field_2._8_8_ = local_b8.field_2._8_8_;
  }
  else {
    local_98.value_._M_dataplus._M_p = local_b8._M_dataplus._M_p;
  }
  local_98.value_._M_string_length = local_b8._M_string_length;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  getUrl(&local_78,this,&local_98);
  local_58._M_buckets = &local_58._M_single_bucket;
  local_58._M_bucket_count = 1;
  local_58._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_58._M_element_count = 0;
  local_58._M_rehash_policy._M_max_load_factor = 1.0;
  local_58._M_rehash_policy._4_4_ = 0;
  local_58._M_rehash_policy._M_next_resize = 0;
  local_58._M_single_bucket = (__node_base_ptr)0x0;
  HttpConsumer::post(__return_storage_ptr__,client,&local_78,(Parameters *)&local_58);
  std::_Hashtable<$ea4cb122$>::~_Hashtable(&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::GoogleCloudKms::deregisterKey(const Path &path) {
  return HttpConsumer::post(client_, getUrl(Path{"keys/deregister/" + path}),
                            Parameters{});
}